

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdumpBase::OnRelocCount
          (BinaryReaderObjdumpBase *this,Index count,Index section_index)

{
  pointer pBVar1;
  bool bVar2;
  ulong uVar3;
  BinarySection BVar4;
  
  uVar3 = (ulong)section_index;
  pBVar1 = (this->section_types_).
           super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar2 = (ulong)((long)(this->section_types_).
                        super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 2) <= uVar3;
  if (bVar2) {
    Stream::Writef(&((this->err_stream_)._M_t.
                     super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                     .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl)->super_Stream,
                   "invalid relocation section index: %u\n");
    BVar4 = Invalid;
  }
  else {
    BVar4 = pBVar1[uVar3];
  }
  this->reloc_section_ = BVar4;
  return (Result)(uint)bVar2;
}

Assistant:

Result BinaryReaderObjdumpBase::OnRelocCount(Index count, Index section_index) {
  if (section_index >= section_types_.size()) {
    err_stream_->Writef("invalid relocation section index: %" PRIindex "\n",
                        section_index);
    reloc_section_ = BinarySection::Invalid;
    return Result::Error;
  }
  reloc_section_ = section_types_[section_index];
  return Result::Ok;
}